

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O0

void check_type_68k(int type,LispPTR *ptr)

{
  DLword *pDVar1;
  LispPTR LVar2;
  LispPTR LVar3;
  LispPTR *ptr_local;
  int type_local;
  
  pDVar1 = MDStypetbl;
  LVar2 = LAddrFromNative(ptr);
  if (type != (*(ushort *)((ulong)(pDVar1 + (LVar2 >> 9)) ^ 2) & 0x7ff)) {
    LVar2 = LAddrFromNative(ptr);
    printf("Mismatching occur !!! LispAddr 0x%x  type %d\n",(ulong)LVar2,(ulong)(uint)type);
    exit(-1);
  }
  LVar2 = LAddrFromNative(ptr);
  pDVar1 = MDStypetbl;
  LVar3 = LAddrFromNative(ptr);
  printf("LispPTR 0x%x is the datatype %d\n",(ulong)LVar2,
         (ulong)(*(ushort *)((ulong)(pDVar1 + (LVar3 >> 9)) ^ 2) & 0x7ff));
  return;
}

Assistant:

void check_type_68k(int type, LispPTR *ptr) {
  if (type != (GetTypeNumber(LAddrFromNative(ptr)))) {
    printf("Mismatching occur !!! LispAddr 0x%x  type %d\n", LAddrFromNative(ptr), type);
    exit(-1);
  }

  printf("LispPTR 0x%x is the datatype %d\n", LAddrFromNative(ptr),
         GetTypeNumber(LAddrFromNative(ptr)));
}